

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O2

void cpu_x86_load_seg_x86_64(CPUX86State *env,int seg_reg,int selector)

{
  uint uVar1;
  uint flags;
  
  uVar1 = (uint)env->eflags;
  if ((env->cr[0] & 1) == 0) {
    flags = 0xf300;
    if ((uVar1 >> 0x11 & 1) == 0) {
      flags = 0x9300;
    }
  }
  else {
    flags = 0xf300;
    if ((uVar1 >> 0x11 & 1) == 0) {
      helper_load_seg_x86_64(env,seg_reg,selector);
      return;
    }
  }
  cpu_x86_load_seg_cache
            (env,seg_reg,selector & 0xffff,(ulong)((selector & 0xffffU) << 4),0xffff,flags);
  return;
}

Assistant:

void cpu_x86_load_seg(CPUX86State *env, int seg_reg, int selector)
{
    if (!(env->cr[0] & CR0_PE_MASK) || (env->eflags & VM_MASK)) {
        int dpl = (env->eflags & VM_MASK) ? 3 : 0;
        selector &= 0xffff;
        cpu_x86_load_seg_cache(env, seg_reg, selector,
                               (selector << 4), 0xffff,
                               DESC_P_MASK | DESC_S_MASK | DESC_W_MASK |
                               DESC_A_MASK | (dpl << DESC_DPL_SHIFT));
    } else {
        helper_load_seg(env, seg_reg, selector);
    }
}